

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O0

bool __thiscall VolumeFile::load(VolumeFile *this,string *filePath)

{
  bool bVar1;
  byte bVar2;
  uchar *puVar3;
  size_type sVar4;
  long *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> headerData;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  path *in_stack_ffffffffffffff20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  byte in_stack_ffffffffffffff37;
  uint64_t *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  VolumeFile *in_stack_ffffffffffffff68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90 [5];
  byte local_1;
  
  boost::filesystem::path::path
            (in_stack_ffffffffffffff20,
             (string_type *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  boost::filesystem::path::operator=
            (in_stack_ffffffffffffff20,
             (path *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  boost::filesystem::path::~path((path *)0x13255c);
  boost::filesystem::path::parent_path();
  boost::filesystem::path::operator=
            (in_stack_ffffffffffffff20,
             (path *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  boost::filesystem::path::~path((path *)0x132595);
  boost::filesystem::path::filename();
  boost::filesystem::path::operator=
            (in_stack_ffffffffffffff20,
             (path *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  boost::filesystem::path::~path((path *)0x1325c5);
  bVar1 = prepareStream((ifstream *)
                        CONCAT17(in_stack_ffffffffffffff4f,
                                 CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)),
                        in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if (bVar1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x132600);
    (**(code **)(*in_RDI + 0x18))();
    bVar1 = readDataAt((VolumeFile *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff28,(uint64_t)in_stack_ffffffffffffff20,
                       CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    if (bVar1) {
      pvVar5 = local_90;
      puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13267e);
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar5);
      bVar2 = (**(code **)(*in_RDI + 0x38))(in_RDI,puVar3,sVar4);
      if ((bVar2 & 1) == 0) {
        local_1 = 0;
      }
      else {
        pvVar5 = local_90;
        puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1326d7);
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar5);
        in_stack_ffffffffffffff37 = (**(code **)(*in_RDI + 0x30))(in_RDI,puVar3,sVar4);
        if ((in_stack_ffffffffffffff37 & 1) == 0) {
          local_1 = 0;
        }
        else {
          bVar1 = parseSegment(in_stack_ffffffffffffff68);
          if (bVar1) {
            local_1 = 1;
          }
          else {
            local_1 = 0;
          }
        }
      }
    }
    else {
      local_1 = 0;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool VolumeFile::load(const std::string& filePath)
{
	m_origPath = boost::filesystem::path(filePath);
	m_basePath = m_origPath.parent_path();
	m_baseName = m_origPath.filename();

	if (!prepareStream(m_mainStream, filePath, &m_mainFileSize)) {
		return false;
	}

	std::vector<uint8_t> headerData;
	if (!readDataAt(headerData, 0, getHeaderSize())) {
		return false;
	}
	if (!decryptHeader(headerData.data(), headerData.size())) {
		return false;
	}
	if (!parseHeader(headerData.data(), headerData.size())) {
		return false;
	}
	if (!parseSegment()) {
		return false;
	}

	return true;
}